

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

Matrix * __thiscall sptk::Matrix::operator=(Matrix *this,Matrix *matrix)

{
  reference pvVar1;
  reference ppdVar2;
  Matrix *in_RSI;
  Matrix *in_RDI;
  vector<double_*,_std::allocator<double_*>_> *unaff_retaddr;
  int i;
  vector<double,_std::allocator<double>_> *in_stack_00000078;
  vector<double,_std::allocator<double>_> *in_stack_00000080;
  int local_14;
  Matrix *__new_size;
  
  if (in_RDI != in_RSI) {
    in_RDI->num_row_ = in_RSI->num_row_;
    in_RDI->num_column_ = in_RSI->num_column_;
    __new_size = in_RDI;
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000080,in_stack_00000078);
    std::vector<double_*,_std::allocator<double_*>_>::resize(unaff_retaddr,(size_type)__new_size);
    for (local_14 = 0; local_14 < in_RDI->num_row_; local_14 = local_14 + 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->data_,(long)(local_14 * in_RDI->num_column_));
      ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                          (&in_RDI->index_,(long)local_14);
      *ppdVar2 = pvVar1;
    }
  }
  return in_RDI;
}

Assistant:

Matrix& Matrix::operator=(const Matrix& matrix) {
  if (this != &matrix) {
    num_row_ = matrix.num_row_;
    num_column_ = matrix.num_column_;
    data_ = matrix.data_;
    index_.resize(num_row_);

    for (int i(0); i < num_row_; ++i) {
      index_[i] = &data_[i * num_column_];
    }
  }
  return *this;
}